

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

bool server::restorescore(clientinfo *ci)

{
  savedscore *this;
  savedscore *sc;
  clientinfo *ci_local;
  
  this = findscore(ci,false);
  if (this != (savedscore *)0x0) {
    savedscore::restore(this,&ci->state);
  }
  return this != (savedscore *)0x0;
}

Assistant:

bool restorescore(clientinfo *ci)
    {
        //if(ci->local) return false;
        savedscore *sc = findscore(ci, false);
        if(sc)
        {
            sc->restore(ci->state);
            return true;
        }
        return false;
    }